

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

void __thiscall kj::ArrayInputStream::skip(ArrayInputStream *this,size_t bytes)

{
  Fault start;
  Exception *pEVar1;
  size_t end;
  ArrayPtr<const_unsigned_char> AVar2;
  uchar *local_40;
  size_t local_38;
  Fault local_20;
  Fault f;
  size_t bytes_local;
  ArrayInputStream *this_local;
  
  f.exception = (Exception *)bytes;
  pEVar1 = (Exception *)ArrayPtr<const_unsigned_char>::size(&this->array);
  if (pEVar1 < f.exception) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[36]>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
               ,0x101,FAILED,"array.size() >= bytes","\"ArrayInputStream ended prematurely.\"",
               (char (*) [36])"ArrayInputStream ended prematurely.");
    f.exception = (Exception *)ArrayPtr<const_unsigned_char>::size(&this->array);
    _::Debug::Fault::~Fault(&local_20);
  }
  start.exception = f.exception;
  end = ArrayPtr<const_unsigned_char>::size(&this->array);
  AVar2 = ArrayPtr<const_unsigned_char>::slice(&this->array,(size_t)start.exception,end);
  local_40 = AVar2.ptr;
  (this->array).ptr = local_40;
  local_38 = AVar2.size_;
  (this->array).size_ = local_38;
  return;
}

Assistant:

void ArrayInputStream::skip(size_t bytes) {
  KJ_REQUIRE(array.size() >= bytes, "ArrayInputStream ended prematurely.") {
    bytes = array.size();
    break;
  }
  array = array.slice(bytes, array.size());
}